

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qhttpmultipart.cpp
# Opt level: O1

void __thiscall QHttpMultiPartPrivate::~QHttpMultiPartPrivate(QHttpMultiPartPrivate *this)

{
  Data *pDVar1;
  
  *(undefined ***)this = &PTR__QHttpMultiPartPrivate_002d3530;
  if (this->device != (QHttpMultiPartIODevice *)0x0) {
    (**(code **)(*(long *)this->device + 0x20))();
  }
  pDVar1 = (this->boundary).d.d;
  if (pDVar1 != (Data *)0x0) {
    LOCK();
    (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         (pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((pDVar1->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&((this->boundary).d.d)->super_QArrayData,1,0x10);
    }
  }
  QArrayDataPointer<QHttpPart>::~QArrayDataPointer(&(this->parts).d);
  QObjectPrivate::~QObjectPrivate(&this->super_QObjectPrivate);
  return;
}

Assistant:

QHttpMultiPartPrivate::~QHttpMultiPartPrivate()
{
    delete device;
}